

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::PostCollectionCallBack(ThreadContext *this)

{
  bool bVar1;
  ScriptContext *local_18;
  ScriptContext *scriptContext;
  ThreadContext *this_local;
  
  CollectionCallBack(this,Collect_End);
  TryExitExpirableCollectMode(this);
  if ((this->recycler != (Recycler *)0x0) &&
     (bVar1 = Memory::Recycler::InCacheCleanupCollection(this->recycler), bVar1)) {
    Memory::Recycler::ClearCacheCleanupCollection(this->recycler);
    for (local_18 = this->scriptContextList; local_18 != (ScriptContext *)0x0;
        local_18 = local_18->next) {
      Js::ScriptContext::CleanupWeakReferenceDictionaries(local_18);
    }
  }
  return;
}

Assistant:

void
ThreadContext::PostCollectionCallBack()
{
    CollectionCallBack(Collect_End);

    TryExitExpirableCollectMode();

    // Recycler is null in the case where the ThreadContext is in the process of creating the recycler and
    // we have a GC triggered (say because the -recyclerStress flag is passed in)
    if (this->recycler != NULL)
    {
        if (this->recycler->InCacheCleanupCollection())
        {
            this->recycler->ClearCacheCleanupCollection();
            for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
            {
                scriptContext->CleanupWeakReferenceDictionaries();
            }
        }
    }
}